

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O0

void __thiscall nv::FastCompressor::compressDXT1(FastCompressor *this,Private *outputOptions)

{
  uint uVar1;
  uint uVar2;
  uint local_70;
  uint local_6c;
  uint x;
  uint y;
  BlockDXT1 block;
  ColorBlock rgba;
  uint h;
  uint w;
  Private *outputOptions_local;
  FastCompressor *this_local;
  
  uVar1 = Image::width(this->m_image);
  uVar2 = Image::height(this->m_image);
  ColorBlock::ColorBlock((ColorBlock *)&block);
  BlockDXT1::BlockDXT1((BlockDXT1 *)&x);
  for (local_6c = 0; local_6c < uVar2; local_6c = local_6c + 4) {
    for (local_70 = 0; local_70 < uVar1; local_70 = local_70 + 4) {
      ColorBlock::init((ColorBlock *)&block,(EVP_PKEY_CTX *)this->m_image);
      QuickCompress::compressDXT1((ColorBlock *)&block,(BlockDXT1 *)&x);
      if (outputOptions->outputHandler != (OutputHandler *)0x0) {
        (*outputOptions->outputHandler->_vptr_OutputHandler[3])(outputOptions->outputHandler,&x,8);
      }
    }
  }
  return;
}

Assistant:

void nv::FastCompressor::compressDXT1(const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT1 block;

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			rgba.init(m_image, x, y);
			
			QuickCompress::compressDXT1(rgba, &block);
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}